

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint __i;
  int iVar2;
  int iVar3;
  int iVar4;
  __uid_t _Var5;
  __uid_t _Var6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  uint *puVar10;
  char *pcVar11;
  size_t sStack_40;
  int argc_local;
  
  argc_local = argc;
  if ((1 < argc) && (*argv[1] != '-')) {
    strncpy(sysout_name_first_arg,argv[1],0x1000);
  }
  read_Xoption(&argc_local,argv);
  iVar4 = argc_local;
  save_argc = argc_local;
  pcVar11 = argv[1];
  save_argv = argv;
  if (pcVar11 != (char *)0x0) {
    iVar2 = strcmp(pcVar11,"-info");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar11,"-INFO"), iVar2 == 0)) {
      print_info_lines();
LAB_00106142:
      exit(0);
    }
    iVar2 = strcmp(pcVar11,"-help");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar11,"-HELP"), iVar2 == 0)) {
      fprintf(_stderr,"%s%s",helpstring,nethubHelpstring);
      goto LAB_00106142;
    }
  }
  for (iVar2 = 1; iVar2 < iVar4; iVar2 = iVar2 + 1) {
    pcVar11 = argv[iVar2];
    iVar3 = strcmp(pcVar11,"-sysout");
    if (iVar3 == 0) {
      iVar2 = iVar2 + 1;
      if (iVar2 < iVar4) {
        strncpy(sysout_name_cl,argv[iVar2],0x1000);
      }
    }
    else {
      iVar3 = strcmp(pcVar11,"-timer");
      if (iVar3 == 0) {
        if (iVar4 <= iVar2 + 1) {
          pcVar11 = "Missing argument after -timer\n";
          sStack_40 = 0x1e;
          goto LAB_00106184;
        }
        piVar7 = __errno_location();
        *piVar7 = 0;
        lVar8 = strtol(argv[iVar2 + 1],(char **)0x0,10);
        if ((*piVar7 != 0) || (lVar8 < 1)) {
          pcVar11 = "Bad value for -timer (integer > 0)\n";
          sStack_40 = 0x23;
          goto LAB_00106184;
        }
        puVar10 = (uint *)&TIMER_INTERVAL;
LAB_00105ddb:
        iVar2 = iVar2 + 1;
        *puVar10 = (uint)lVar8;
      }
      else {
        cVar1 = *pcVar11;
        if (((cVar1 == '-') && (pcVar11[1] == 'm')) && (pcVar11[2] == '\0')) {
          iVar2 = iVar2 + 1;
          if (iVar4 <= iVar2) {
            pcVar11 = "Missing argument after -m\n";
            sStack_40 = 0x1a;
            goto LAB_00106184;
          }
          piVar7 = __errno_location();
          *piVar7 = 0;
          lVar8 = strtol(argv[iVar2],(char **)0x0,10);
          if ((*piVar7 != 0) || (lVar8 < 1)) {
            pcVar11 = "Bad value for -m (integer > 0)\n";
            goto LAB_00106182;
          }
          sysout_size = (uint)lVar8;
        }
        else {
          iVar3 = strcmp(pcVar11,"-NF");
          if (iVar3 == 0) {
            please_fork = 0;
          }
          else {
            iVar3 = strcmp(pcVar11,"-INIT");
            if (iVar3 == 0) {
              for_makeinit = 1;
            }
            else if ((((cVar1 != '-') || (pcVar11[1] != 'E')) || (pcVar11[2] != '\0')) &&
                    (iVar3 = strcmp(pcVar11,"-xpages"), iVar3 == 0)) {
              if (iVar2 + 1 < iVar4) {
                piVar7 = __errno_location();
                *piVar7 = 0;
                lVar8 = strtol(argv[iVar2 + 1],(char **)0x0,10);
                if ((*piVar7 == 0) && (0 < lVar8)) {
                  puVar10 = &maxpages;
                  goto LAB_00105ddb;
                }
                pcVar11 = "Bad value for -xpages (integer > 0)\n";
                sStack_40 = 0x24;
                goto LAB_00106184;
              }
              pcVar11 = "Missing argument after -xpages\n";
              goto LAB_00106182;
            }
          }
        }
      }
    }
    iVar4 = argc_local;
  }
  if (sysout_name_cl[0] == '\0') {
    if (sysout_name_first_arg[0] != '\0') {
      pcVar11 = sysout_name_first_arg;
      goto LAB_00105e79;
    }
    pcVar11 = getenv("LDESRCESYSOUT");
    if ((pcVar11 != (char *)0x0) || (pcVar11 = getenv("LDESOURCESYSOUT"), pcVar11 != (char *)0x0))
    goto LAB_00105e79;
    if (sysout_name_xrm[0] != '\0') {
      pcVar11 = sysout_name_xrm;
      goto LAB_00105e79;
    }
    pcVar11 = getenv("HOME");
    if (pcVar11 != (char *)0x0) {
      strncpy(sysout_name,pcVar11,0x1000);
      sVar9 = strlen(sysout_name);
      builtin_strncpy(sysout_name + sVar9,"/lisp.vi",8);
      builtin_strncpy(sysout_name + sVar9 + 8,"rtualmem",8);
      sysout_name[sVar9 + 0x10] = '\0';
    }
  }
  else {
    pcVar11 = sysout_name_cl;
LAB_00105e79:
    strncpy(sysout_name,pcVar11,0x1000);
  }
  if ((sysout_name[0] == '\0') || (iVar4 = access(sysout_name,4), iVar4 != 0)) {
    perror("Couldn\'t find a sysout to run");
    fprintf(_stderr,"Looking for: %s\n",sysout_name);
    fprintf(_stderr,"%s%s",helpstring,nethubHelpstring);
    goto LAB_0010618d;
  }
  _Var5 = getuid();
  _Var6 = geteuid();
  if (_Var5 == _Var6) {
LAB_00105eb6:
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      LispReadFds.__fds_bits[lVar8] = 0;
    }
    iVar4 = FindUnixPipes();
    if ((iVar4 != 0) && (please_fork != 0)) {
      fwrite("Failed to find UNIXCOMM file handles; no processes\n",0x33,1,_stderr);
    }
    make_dsp_instance(currentdsp,(char *)0x0,0,0,1);
    sysout_size = sysout_loader(sysout_name,sysout_size);
    build_lisp_map();
    init_ifpage(sysout_size);
    init_iopage();
    init_miscstats();
    init_storage();
    set_cursor();
    iVar4 = init_finfo();
    if (iVar4 != 0) {
      if (for_makeinit == 0) {
        init_keyboard(0);
      }
      start_lisp();
      return 0;
    }
    pcVar11 = "Cannot allocate internal data.\n";
LAB_00106182:
    sStack_40 = 0x1f;
  }
  else {
    fwrite("Effective user is not real user.  Resetting uid\n",0x30,1,_stderr);
    _Var5 = getuid();
    iVar4 = setuid(_Var5);
    if (iVar4 != -1) goto LAB_00105eb6;
    pcVar11 = "Unable to reset user id to real user id\n";
    sStack_40 = 0x28;
  }
LAB_00106184:
  fwrite(pcVar11,sStack_40,1,_stderr);
LAB_0010618d:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  int i;
  char *envname;
  extern int TIMER_INTERVAL;
  extern fd_set LispReadFds;
  long tmpint;

#ifdef MAIKO_ENABLE_FOREIGN_FUNCTION_INTERFACE
  if (dld_find_executable(argv[0]) == 0) {
    perror("Name of executable not found.");
  } else if (dld_init(dld_find_executable(argv[0])) != 0) {
    dld_perror("Can't init DLD.");
  }
#endif /* MAIKO_ENABLE_FOREIGN_FUNCTION_INTERFACE */

#ifdef PROFILE
  moncontrol(0); /* initially stop sampling */
#endif           /* PROFILE */

  //
  //
  //  Process Command Line Arguments
  //
  //

  // First check if the first argument is a sysout name
  // and save it away if it is in case the X windows
  // arg processing changes argc/argv
  if (argc > 1 && argv[1][0] != '-') {
    strncpy(sysout_name_first_arg, argv[1], MAXPATHLEN);
  }


#ifdef XWINDOW
  read_Xoption(&argc, argv);
#endif /* XWINDOW */

  save_argc = argc;
  save_argv = argv;

  i = 1;

  if (argv[i] && ((strcmp(argv[i], "-info") == 0) || (strcmp(argv[i], "-INFO") == 0))) {
    print_info_lines();
    exit(0);
  }

  if (argv[i] && ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "-HELP") == 0))) {
    (void)fprintf(stderr, "%s%s", helpstring, nethubHelpstring);
    exit(0);
  }


  for (; i < argc; i += 1) { /* step by 1 in case of typo */

   // NOTE:  in the case of X Windows, some of the args being checked for in this loop
   // have already been processed (and removed from argv) by the call to read_Xoption()
   // above.  (See readXoption() in xrdopt.c)

   /* Check for -sysout arg */
    if (!strcmp(argv[i], "-sysout")) {
      if (argc > ++i) {
        strncpy(sysout_name_cl, argv[i], MAXPATHLEN);
      }
    }

    /* -timer and -m are undocumented and somewhat dangerous... */

    else if (!strcmp(argv[i], "-timer")) { /**** timer interval	****/
      if (argc > ++i) {
        errno = 0;
        tmpint = strtol(argv[i], (char **)NULL, 10);
        if (errno == 0 && tmpint > 0) {
          TIMER_INTERVAL = tmpint;
        } else {
          (void)fprintf(stderr, "Bad value for -timer (integer > 0)\n");
          exit(1);
        }
      } else {
        (void)fprintf(stderr, "Missing argument after -timer\n");
        exit(1);
      }
    }

    else if (!strcmp(argv[i], "-m")) { /**** sysout size	****/
      if (argc > ++i) {
        errno = 0;
        tmpint = strtol(argv[i], (char **)NULL, 10);
        if (errno == 0 && tmpint > 0) {
          sysout_size = (unsigned)tmpint;
        } else {
          (void)fprintf(stderr, "Bad value for -m (integer > 0)\n");
          exit(1);
        }
      } else {
        (void)fprintf(stderr, "Missing argument after -m\n");
        exit(1);
      }
    }

    else if (!strcmp(argv[i], "-NF")) { /****  Don't fork (for dbxing)	****/
      please_fork = 0;
    }

    else if (!strcmp(argv[i], "-INIT")) { /*** init sysout, no packaged */
      for_makeinit = 1;
    }
#ifdef DOS
    else if ((strcmp(argv[i], "-vga") == 0) || (strcmp(argv[i], "-VGA") == 0)) {
      dosdisplaymode = 1;
    } else if ((strcmp(argv[i], "-vesa102") == 0) || (strcmp(argv[i], "-VESA102") == 0)) {
      dosdisplaymode = 0x102;
    }